

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

int storestring(char *n,char **p,int nostrip)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (*p == n) {
    iVar3 = 0;
  }
  else {
    undo_checkpoint();
    iVar3 = 0;
    if (n == (char *)0x0) {
      iVar2 = 0;
      pcVar6 = (char *)0x0;
    }
    else {
      if (nostrip == 0) {
        n = n + -1;
        do {
          pbVar1 = (byte *)(n + 1);
          n = n + 1;
          iVar2 = isspace((uint)*pbVar1);
        } while (iVar2 != 0);
      }
      sVar4 = strlen(n);
      pcVar5 = n + sVar4;
      pcVar6 = pcVar5;
      if (nostrip == 0) {
        do {
          pcVar5 = pcVar6;
          if (pcVar5 <= n) break;
          iVar2 = isspace((uint)(byte)pcVar5[-1]);
          pcVar6 = pcVar5 + -1;
        } while (iVar2 != 0);
      }
      iVar2 = (int)pcVar5 - (int)n;
      pcVar6 = (char *)0x0;
      if (iVar2 != 0) {
        pcVar6 = n;
      }
    }
    pcVar5 = *p;
    if (pcVar6 != pcVar5) {
      if (pcVar5 != (char *)0x0 && pcVar6 != (char *)0x0) {
        iVar3 = strncmp(pcVar6,pcVar5,(long)iVar2);
        if ((iVar3 == 0) && (pcVar5[iVar2] == '\0')) {
          return 0;
        }
      }
      free(pcVar5);
      if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = (char *)malloc((long)(iVar2 + 1));
        fl_strlcpy(pcVar5,pcVar6,(long)(iVar2 + 1));
      }
      *p = pcVar5;
      iVar3 = 1;
      set_modflag(1);
    }
  }
  return iVar3;
}

Assistant:

int storestring(const char *n, const char * & p, int nostrip) {
  if (n == p) return 0;
  undo_checkpoint();
  int length = 0;
  if (n) { // see if blank, strip leading & trailing blanks
    if (!nostrip) while (isspace((int)(unsigned char)*n)) n++;
    const char *e = n + strlen(n);
    if (!nostrip) while (e > n && isspace((int)(unsigned char)*(e-1))) e--;
    length = e-n;
    if (!length) n = 0;
  }    
  if (n == p) return 0;
  if (n && p && !strncmp(n,p,length) && !p[length]) return 0;
  if (p) free((void *)p);
  if (!n || !*n) {
    p = 0;
  } else {
    char *q = (char *)malloc(length+1);
    strlcpy(q,n,length+1);
    p = q;
  }
  set_modflag(1);
  return 1;
}